

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O2

bool __thiscall
EmmyFacade::RegisterTypeName(EmmyFacade *this,lua_State *L,string *typeName,string *err)

{
  bool bVar1;
  shared_ptr<Debugger> debugger;
  Debugger *local_28;
  
  EmmyDebuggerManager::GetDebugger
            ((EmmyDebuggerManager *)&stack0xffffffffffffffd8,
             (lua_State *)&this->_emmyDebuggerManager);
  if (local_28 == (Debugger *)0x0) {
    std::__cxx11::string::assign((char *)err);
    bVar1 = false;
  }
  else {
    bVar1 = Debugger::RegisterTypeName(local_28,typeName,err);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  return bVar1;
}

Assistant:

bool EmmyFacade::RegisterTypeName(lua_State *L, const std::string &typeName, std::string &err) {
	auto debugger = GetDebugger(L);
	if (!debugger) {
		err = "Debugger does not exist";
		return false;
	}
	const auto suc = debugger->RegisterTypeName(typeName, err);
	return suc;
}